

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O0

void av1_inv_txfm2d_add_64x16_c(int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,int bd)

{
  void *in_RDI;
  int txfm_buf [1152];
  int32_t mod_input [1024];
  TX_SIZE in_stack_ffffffffffffddee;
  TX_TYPE in_stack_ffffffffffffddef;
  int32_t *in_stack_ffffffffffffddf0;
  int in_stack_ffffffffffffddfc;
  uint16_t *in_stack_ffffffffffffde00;
  int32_t *in_stack_ffffffffffffde08;
  int in_stack_ffffffffffffde18;
  undefined1 local_1050 [2048];
  undefined1 auStack_850 [2120];
  
  memcpy(local_1050,in_RDI,0x800);
  memset(auStack_850,0,0x800);
  inv_txfm2d_add_facade
            (in_stack_ffffffffffffde08,in_stack_ffffffffffffde00,in_stack_ffffffffffffddfc,
             in_stack_ffffffffffffddf0,in_stack_ffffffffffffddef,in_stack_ffffffffffffddee,
             in_stack_ffffffffffffde18);
  return;
}

Assistant:

void av1_inv_txfm2d_add_64x16_c(const int32_t *input, uint16_t *output,
                                int stride, TX_TYPE tx_type, int bd) {
  // Remap 32x16 input into a modified 64x16 by:
  // - Copying over these values in top-left 32x16 locations.
  // - Setting the rest of the locations to 0.
  int32_t mod_input[16 * 64];
  memcpy(mod_input, input, 16 * 32 * sizeof(*mod_input));
  memset(mod_input + 16 * 32, 0, 16 * 32 * sizeof(*mod_input));
  DECLARE_ALIGNED(32, int, txfm_buf[16 * 64 + 64 + 64]);
  inv_txfm2d_add_facade(mod_input, output, stride, txfm_buf, tx_type, TX_64X16,
                        bd);
}